

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j,short *data,stbi__huffman *hdc,int b)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  
  if (j->spec_end != 0) {
    stbi__g_failure_reason = "can\'t merge dc and ac";
    return 0;
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->succ_high == 0) {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    uVar3 = stbi__jpeg_huff_decode(j,hdc);
    if (uVar3 < 0x10) {
      if (uVar3 == 0) {
        uVar3 = 0;
      }
      else {
        uVar3 = stbi__extend_receive(j,uVar3);
      }
      uVar5 = j->img_comp[b].dc_pred;
      if (-1 < (int)(uVar5 ^ uVar3)) {
        bVar6 = (int)uVar5 <= (int)(uVar3 ^ 0x7fffffff);
        if ((int)(uVar5 & uVar3) < 0) {
          bVar6 = (int)(-0x80000000 - uVar3) <= (int)uVar5;
        }
        if (!bVar6) {
          stbi__g_failure_reason = "bad delta";
          return 0;
        }
      }
      uVar5 = uVar5 + uVar3;
      j->img_comp[b].dc_pred = uVar5;
      bVar4 = (byte)j->succ_low;
      uVar3 = 1 << (bVar4 & 0x1f);
      if ((int)(uVar3 ^ uVar5) < 0) {
        if (j->succ_low == 0x1f) {
          bVar7 = false;
          bVar6 = uVar5 == 0;
          uVar1 = uVar5;
        }
        else {
          uVar3 = -0x8000 / (int)uVar3;
          bVar7 = SBORROW4(uVar3,uVar5);
          uVar1 = uVar3 - uVar5;
          bVar6 = uVar3 == uVar5;
        }
        bVar6 = bVar6 || bVar7 != (int)uVar1 < 0;
      }
      else {
        bVar6 = (int)uVar5 <= (int)(0x7fffU >> (bVar4 & 0x1f));
      }
      if (bVar6) {
        *data = (short)(uVar5 << (bVar4 & 0x1f));
        return 1;
      }
    }
    stbi__g_failure_reason = "can\'t merge dc and ac";
    return 0;
  }
  iVar2 = stbi__jpeg_get_bit(j);
  if (iVar2 == 0) {
    return 1;
  }
  *data = *data + (short)(1 << ((byte)j->succ_low & 0x1f));
  return 1;
}

Assistant:

static int stbi__jpeg_decode_block_prog_dc(stbi__jpeg *j, short data[64], stbi__huffman *hdc, int b)
{
   int diff,dc;
   int t;
   if (j->spec_end != 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);

   if (j->succ_high == 0) {
      // first scan for DC coefficient, must be first
      memset(data,0,64*sizeof(data[0])); // 0 all the ac values now
      t = stbi__jpeg_huff_decode(j, hdc);
      if (t < 0 || t > 15) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      diff = t ? stbi__extend_receive(j, t) : 0;

      if (!stbi__addints_valid(j->img_comp[b].dc_pred, diff)) return stbi__err("bad delta", "Corrupt JPEG");
      dc = j->img_comp[b].dc_pred + diff;
      j->img_comp[b].dc_pred = dc;
      if (!stbi__mul2shorts_valid(dc, 1 << j->succ_low)) return stbi__err("can't merge dc and ac", "Corrupt JPEG");
      data[0] = (short) (dc * (1 << j->succ_low));
   } else {
      // refinement scan for DC coefficient
      if (stbi__jpeg_get_bit(j))
         data[0] += (short) (1 << j->succ_low);
   }
   return 1;
}